

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O3

void compute_coord(int num_dims,int *strip_sizes,int target_rank,int *coord,int *dim_order,
                  bool *flipped_dim)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < num_dims) {
    uVar4 = 0;
    do {
      lVar5 = (ulong)(uint)num_dims - 1;
      iVar2 = target_rank;
      if (uVar4 < num_dims - 1) {
        do {
          iVar2 = iVar2 / strip_sizes[dim_order[lVar5]];
          lVar5 = lVar5 + -1;
        } while ((long)uVar4 < lVar5);
      }
      iVar1 = dim_order[uVar4];
      uVar3 = iVar2 % strip_sizes[iVar1];
      if (flipped_dim[iVar1] == false) {
        coord[iVar1] = coord[iVar1] + uVar3;
      }
      else {
        coord[iVar1] = coord[iVar1] + strip_sizes[iVar1] + ~uVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)num_dims);
  }
  return;
}

Assistant:

void compute_coord(int num_dims, const int *strip_sizes, int target_rank, int *coord, const int *dim_order,
				   const bool *flipped_dim) {
  int curr_dim;
  for (int dim_index = 0; dim_index < num_dims; dim_index++) {
	curr_dim = dim_order[dim_index];
	int coord_component = target_rank;
	int strip_size = strip_sizes[curr_dim];

	for (int rem_dim_index = num_dims - 1; rem_dim_index > dim_index; rem_dim_index--) {
	  int rem_dim = dim_order[rem_dim_index];
	  coord_component /= strip_sizes[rem_dim];
	}

	if (flipped_dim[curr_dim]) {
	  coord[curr_dim] += strip_size - ((coord_component % strip_size) + 1);
	} else {
	  coord[curr_dim] += coord_component % strip_size;
	}
  }
}